

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleIndexVertexArray.cpp
# Opt level: O3

void __thiscall
cbtTriangleIndexVertexArray::cbtTriangleIndexVertexArray
          (cbtTriangleIndexVertexArray *this,int numTriangles,int *triangleIndexBase,
          int triangleIndexStride,int numVertices,cbtScalar *vertexBase,int vertexStride)

{
  cbtIndexedMesh local_40;
  
  (this->super_cbtStridingMeshInterface).m_scaling.m_floats[0] = 1.0;
  (this->super_cbtStridingMeshInterface).m_scaling.m_floats[1] = 1.0;
  (this->super_cbtStridingMeshInterface).m_scaling.m_floats[2] = 1.0;
  (this->super_cbtStridingMeshInterface).m_scaling.m_floats[3] = 0.0;
  (this->super_cbtStridingMeshInterface)._vptr_cbtStridingMeshInterface =
       (_func_int **)&PTR__cbtTriangleIndexVertexArray_00b49818;
  (this->m_indexedMeshes).m_ownsMemory = true;
  (this->m_indexedMeshes).m_data = (cbtIndexedMesh *)0x0;
  (this->m_indexedMeshes).m_size = 0;
  (this->m_indexedMeshes).m_capacity = 0;
  this->m_hasAabb = 0;
  local_40.m_indexType = PHY_INTEGER;
  local_40.m_vertexType = PHY_FLOAT;
  local_40.m_vertexStride = vertexStride;
  local_40.m_numTriangles = numTriangles;
  local_40.m_triangleIndexBase = (uchar *)triangleIndexBase;
  local_40.m_triangleIndexStride = triangleIndexStride;
  local_40.m_numVertices = numVertices;
  local_40.m_vertexBase = (uchar *)vertexBase;
  addIndexedMesh(this,&local_40,PHY_INTEGER);
  return;
}

Assistant:

cbtTriangleIndexVertexArray::cbtTriangleIndexVertexArray(int numTriangles, int* triangleIndexBase, int triangleIndexStride, int numVertices, cbtScalar* vertexBase, int vertexStride)
	: m_hasAabb(0)
{
	cbtIndexedMesh mesh;

	mesh.m_numTriangles = numTriangles;
	mesh.m_triangleIndexBase = (const unsigned char*)triangleIndexBase;
	mesh.m_triangleIndexStride = triangleIndexStride;
	mesh.m_numVertices = numVertices;
	mesh.m_vertexBase = (const unsigned char*)vertexBase;
	mesh.m_vertexStride = vertexStride;

	addIndexedMesh(mesh);
}